

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimGen(Gia_Man_t *pGia)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  Vec_Wrd_t *p;
  FILE *__stream;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  uint local_44;
  uint local_40;
  int Id;
  int k;
  int i;
  FILE *pFile;
  Vec_Wrd_t *vSim0;
  Gia_Obj_t *pObj;
  int nWords;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManCiNum(pGia);
  p = Vec_WrdStartRandom(iVar1 * 4);
  __stream = fopen("comp_sim.c","wb");
  fprintf(__stream,"#include <stdio.h>\n");
  fprintf(__stream,"#include <stdlib.h>\n");
  fprintf(__stream,"#include <time.h>\n");
  fprintf(__stream,"int main()\n");
  fprintf(__stream,"{\n");
  fprintf(__stream,"  clock_t clkThis = clock();\n");
  fprintf(__stream,"  unsigned long Res = 0;\n");
  fprintf(__stream,"  int i;\n");
  fprintf(__stream,"  srand(time(NULL));\n");
  fprintf(__stream,"  for ( i = 0; i < 2000; i++ )\n");
  fprintf(__stream,"  {\n");
  for (local_40 = 0; (int)local_40 < 4; local_40 = local_40 + 1) {
    fprintf(__stream,"  unsigned long s%07d_%d = 0x%08x%08x;\n",0,(ulong)local_40,0);
  }
  Id = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCis);
    bVar6 = false;
    if (Id < iVar1) {
      pGVar5 = Gia_ManCi(pGia,Id);
      local_44 = Gia_ObjId(pGia,pGVar5);
      bVar6 = local_44 != 0;
    }
    if (!bVar6) break;
    for (local_40 = 0; (int)local_40 < 4; local_40 = local_40 + 1) {
      fprintf(__stream,
              "  unsigned long s%07d_%d = ((unsigned long)rand() << 48) | ((unsigned long)rand() << 32) | ((unsigned long)rand() << 16) | (unsigned long)rand();\n"
              ,(ulong)local_44,(ulong)local_40);
    }
    Id = Id + 1;
  }
  local_44 = 0;
  while( true ) {
    bVar6 = false;
    if ((int)local_44 < pGia->nObjs) {
      vSim0 = (Vec_Wrd_t *)Gia_ManObj(pGia,local_44);
      bVar6 = vSim0 != (Vec_Wrd_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vSim0);
    if (iVar1 != 0) {
      for (local_40 = 0; (int)local_40 < 4; local_40 = local_40 + 1) {
        iVar1 = Gia_ObjFaninC0((Gia_Obj_t *)vSim0);
        uVar2 = 0x20;
        if (iVar1 != 0) {
          uVar2 = 0x7e;
        }
        uVar4 = Gia_ObjFaninId0((Gia_Obj_t *)vSim0,local_44);
        iVar1 = Gia_ObjFaninC1((Gia_Obj_t *)vSim0);
        uVar3 = 0x7e;
        if (iVar1 != 0) {
          uVar3 = 0x20;
        }
        iVar1 = Gia_ObjFaninId1((Gia_Obj_t *)vSim0,local_44);
        fprintf(__stream,"  unsigned long s%07d_%d = %cs%07d_%d & %cs%07d_%d;\n",(ulong)local_44,
                (ulong)local_40,(ulong)uVar2,(ulong)uVar4,local_40,uVar3,iVar1,local_40);
      }
    }
    local_44 = local_44 + 1;
  }
  Id = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCos);
    bVar6 = false;
    if (Id < iVar1) {
      pGVar5 = Gia_ManCo(pGia,Id);
      local_44 = Gia_ObjId(pGia,pGVar5);
      bVar6 = local_44 != 0;
    }
    if (!bVar6) break;
    pGVar5 = Gia_ManObj(pGia,local_44);
    for (local_40 = 0; (int)local_40 < 4; local_40 = local_40 + 1) {
      iVar1 = Gia_ObjFaninC0(pGVar5);
      uVar2 = 0x20;
      if (iVar1 != 0) {
        uVar2 = 0x7e;
      }
      uVar4 = Gia_ObjFaninId0(pGVar5,local_44);
      fprintf(__stream,"  Res ^= %cs%07d_%d;\n",(ulong)uVar2,(ulong)uVar4,(ulong)local_40);
    }
    Id = Id + 1;
  }
  Vec_WrdFree(p);
  fprintf(__stream,"  }\n");
  fprintf(__stream,"  printf( \"Res = 0x%%08x    \", (unsigned)Res );\n");
  fprintf(__stream,
          "  printf( \"Time = %%6.2f sec\\n\", (float)(clock() - clkThis)/CLOCKS_PER_SEC );\n");
  fprintf(__stream,"  return 1;\n");
  fprintf(__stream,"}\n");
  fclose(__stream);
  return;
}

Assistant:

void Gia_ManSimGen( Gia_Man_t * pGia )
{
    int nWords = 4;
    Gia_Obj_t * pObj;
    Vec_Wrd_t * vSim0 = Vec_WrdStartRandom( Gia_ManCiNum(pGia) * nWords );
    FILE * pFile = fopen( "comp_sim.c", "wb" );
    int i, k, Id;
    fprintf( pFile, "#include <stdio.h>\n" );
    fprintf( pFile, "#include <stdlib.h>\n" );
    fprintf( pFile, "#include <time.h>\n" );
    fprintf( pFile, "int main()\n" );
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  clock_t clkThis = clock();\n" );
    fprintf( pFile, "  unsigned long Res = 0;\n" );
    fprintf( pFile, "  int i;\n" );
    fprintf( pFile, "  srand(time(NULL));\n" );
    fprintf( pFile, "  for ( i = 0; i < 2000; i++ )\n" );
    fprintf( pFile, "  {\n" );
    for ( k = 0; k < nWords; k++ )
        fprintf( pFile, "  unsigned long s%07d_%d = 0x%08x%08x;\n", 0, k, 0, 0 );
    Gia_ManForEachCiId( pGia, Id, i )
    {
        //word * pSim = Vec_WrdEntryP(vSim0, i*nWords);
        //unsigned * pSimU = (unsigned *)pSim;
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  unsigned long s%07d_%d = ((unsigned long)rand() << 48) | ((unsigned long)rand() << 32) | ((unsigned long)rand() << 16) | (unsigned long)rand();\n", Id, k );
    }
    Gia_ManForEachAnd( pGia, pObj, Id )
    {
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  unsigned long s%07d_%d = %cs%07d_%d & %cs%07d_%d;\n", Id, k, 
                Gia_ObjFaninC0(pObj) ? '~' : ' ', Gia_ObjFaninId0(pObj, Id), k, 
                Gia_ObjFaninC1(pObj) ? ' ' : '~', Gia_ObjFaninId1(pObj, Id), k );
    }
    Gia_ManForEachCoId( pGia, Id, i )
    {
        pObj = Gia_ManObj(pGia, Id);
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  Res ^= %cs%07d_%d;\n", Gia_ObjFaninC0(pObj) ? '~' : ' ', Gia_ObjFaninId0(pObj, Id), k );
    }
    Vec_WrdFree( vSim0 );
    fprintf( pFile, "  }\n" );
    fprintf( pFile, "  printf( \"Res = 0x%%08x    \", (unsigned)Res );\n" );
    fprintf( pFile, "  printf( \"Time = %%6.2f sec\\n\", (float)(clock() - clkThis)/CLOCKS_PER_SEC );\n" );
    fprintf( pFile, "  return 1;\n" );
    fprintf( pFile, "}\n" );
    fclose( pFile );
}